

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O3

void __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::printBasicInfo(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *this,ostream *os)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar4;
  string local_50;
  
  operator<<(os,(this->super_Node).type_);
  iVar1 = (*(this->super_Node)._vptr_Node[2])(this);
  if ((char)iVar1 != '\0') {
    local_50._M_dataplus._M_p._0_1_ = 0x20;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
    Name::fullname_abi_cxx11_(&local_50,&(this->nameAttribute_).attr_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                       local_50._M_dataplus._M_p._0_1_),local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
                      local_50.field_2._M_allocated_capacity + 1);
    }
  }
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  uVar2 = (*(this->super_Node)._vptr_Node[4])(this);
  if (uVar2 == 0) {
    uVar2 = (*(this->super_Node)._vptr_Node[7])(this);
  }
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"name ",5);
      iVar1 = (*(this->super_Node)._vptr_Node[8])(this,(ulong)uVar4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,*(char **)CONCAT44(extraout_var,iVar1),
                          ((undefined8 *)CONCAT44(extraout_var,iVar1))[1]);
      local_50._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
      if ((this->super_Node).type_ != AVRO_NUM_TYPES) {
        iVar1 = (*(this->super_Node)._vptr_Node[5])(this,(ulong)uVar4);
        (**(code **)(**(long **)CONCAT44(extraout_var_00,iVar1) + 0x70))
                  (*(long **)CONCAT44(extraout_var_00,iVar1),os);
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  if ((uint)((this->super_Node).type_ + ~AVRO_NULL) < 6) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"end ",4);
    poVar3 = operator<<(os,(this->super_Node).type_);
    local_50._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
  }
  return;
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::printBasicInfo(std::ostream &os) const
{
    os << type();
    if(hasName()) {
        os << ' ' << nameAttribute_.get();
    }

    if(D::hasAttribute) {
        os << " " << sizeAttribute_.get();
    }
    os << '\n';
    int count = leaves();
    count = count ? count : names();
    for(int i= 0; i < count; ++i) {
        if( C::hasAttribute ) {
            os << "name " << nameAt(i) << '\n';
        }
        if( type() != AVRO_SYMBOLIC && leafAttributes_.hasAttribute) {
            leafAt(i)->printBasicInfo(os);
        }
    }
    if(isCompound(type())) {
        os << "end " << type() << '\n';
    }
}